

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O1

ALLEGRO_FS_ENTRY * fs_stdio_read_directory(ALLEGRO_FS_ENTRY *fp)

{
  int iVar1;
  int iVar2;
  dirent *pdVar3;
  int *piVar4;
  size_t sVar5;
  size_t sVar6;
  WRAP_CHAR *abs_path;
  ALLEGRO_FS_ENTRY *pAVar7;
  char *__s1;
  
  pdVar3 = readdir((DIR *)fp[0x15].vtable);
  do {
    if (pdVar3 == (dirent *)0x0) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
LAB_0015aeea:
      al_set_errno(iVar1);
      return (ALLEGRO_FS_ENTRY *)0x0;
    }
    __s1 = pdVar3->d_name;
    iVar1 = strcmp(__s1,".");
    if ((iVar1 != 0) && (iVar1 = strcmp(__s1,".."), iVar1 != 0)) {
      sVar5 = strlen((char *)fp[1].vtable);
      sVar6 = strlen(__s1);
      iVar2 = (int)sVar6;
      iVar1 = (int)sVar5;
      abs_path = (WRAP_CHAR *)
                 al_malloc_with_context
                           ((long)(iVar2 + iVar1 + 2),0x1b9,
                            "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
                            ,"fs_stdio_read_directory");
      if (abs_path != (WRAP_CHAR *)0x0) {
        sVar5 = (size_t)iVar1;
        memcpy(abs_path,fp[1].vtable,sVar5);
        if ((iVar1 < 1) || (abs_path[iVar1 - 1] != '/')) {
          iVar1 = iVar1 + iVar2 + 1;
          abs_path[sVar5] = '/';
          memcpy(abs_path + sVar5 + 1,__s1,(long)iVar2);
        }
        else {
          memcpy(abs_path + sVar5,__s1,(long)iVar2);
          iVar1 = iVar2 + iVar1;
        }
        abs_path[iVar1] = '\0';
        pAVar7 = create_abs_path_entry(abs_path);
        al_free_with_context
                  (abs_path,0x1cd,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/fshook_stdio.c"
                   ,"fs_stdio_read_directory");
        return pAVar7;
      }
      iVar1 = 0xc;
      goto LAB_0015aeea;
    }
    pdVar3 = readdir((DIR *)fp[0x15].vtable);
  } while( true );
}

Assistant:

static ALLEGRO_FS_ENTRY *fs_stdio_read_directory(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   // FIXME: Must use readdir_r as Allegro allows file functions being
   // called from different threads.
   WRAP_DIRENT_TYPE *ent;
   ALLEGRO_FS_ENTRY *ret;

   ASSERT(fp_stdio->dir);

   do {
      ent = WRAP_READDIR(fp_stdio->dir);
      if (!ent) {
         al_set_errno(errno);
         return NULL;
      }
      /* Don't bother the user with these entries. */
   } while (0 == WRAP_STRCMP(ent->d_name, WRAP_LIT("."))
         || 0 == WRAP_STRCMP(ent->d_name, WRAP_LIT("..")));

#ifdef ALLEGRO_WINDOWS
   {
      wchar_t buf[MAX_PATH];
      int buflen;
      
      buflen = _snwprintf(buf, MAX_PATH, L"%s\\%s",
         fp_stdio->abs_path, ent->d_name);
      if (buflen >= MAX_PATH) {
         al_set_errno(ERANGE);
         return NULL;
      }
      ret = create_abs_path_entry(buf);
   }
#else
   {
      int abs_path_len = strlen(fp_stdio->abs_path);
      int ent_name_len = strlen(ent->d_name);
      char *buf = al_malloc(abs_path_len + 1 + ent_name_len + 1);
      if (!buf) {
         al_set_errno(ENOMEM);
         return NULL;
      }
      memcpy(buf, fp_stdio->abs_path, abs_path_len);
      if (  (abs_path_len >= 1) &&
            buf[abs_path_len - 1] == ALLEGRO_NATIVE_PATH_SEP)
      {
         /* do NOT add a new separator if we have one already */
         memcpy(buf + abs_path_len, ent->d_name, ent_name_len);
         buf[abs_path_len + ent_name_len] = '\0';
      }
      else {
         /* append separator */
         buf[abs_path_len] = ALLEGRO_NATIVE_PATH_SEP;
         memcpy(buf + abs_path_len + 1, ent->d_name, ent_name_len);
         buf[abs_path_len + 1 + ent_name_len] = '\0';
      }
      ret = create_abs_path_entry(buf);
      al_free(buf);
   }
#endif
   return ret;
}